

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  int iVar1;
  string *name;
  long lVar2;
  char nMatches [2];
  string local_50;
  
  name = matchVariables_abi_cxx11_;
  iVar1 = 0;
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&re->regmatch,(int)lVar2);
    if (local_50._M_string_length != 0) {
      AddDefinition(this,name,
                    (char *)CONCAT62(local_50._M_dataplus._M_p._2_6_,
                                     CONCAT11(local_50._M_dataplus._M_p._1_1_,
                                              local_50._M_dataplus._M_p._0_1_)));
      cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      iVar1 = (int)lVar2 + 0x30;
    }
    std::__cxx11::string::~string((string *)&local_50);
    name = name + 1;
  }
  local_50._M_dataplus._M_p._0_1_ = (undefined1)iVar1;
  local_50._M_dataplus._M_p._1_1_ = 0;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,(char *)&local_50);
  cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m.c_str());
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}